

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O2

bool DirImage(string *path)

{
  bool bVar1;
  shared_ptr<Disk> disk;
  
  std::make_shared<Disk>();
  bVar1 = ReadImage(path,&disk,true);
  if (bVar1) {
    bVar1 = Dir(disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  else {
    bVar1 = false;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar1;
}

Assistant:

bool DirImage(const std::string& path)
{
    auto disk = std::make_shared<Disk>();
    return ReadImage(path, disk) && Dir(*disk);
}